

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::MethodHeader::MethodHeader
          (MethodHeader *this,string *selector,ArgumentList *arguments)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MethodHeader_001701d0;
  std::__cxx11::string::string((string *)&this->selector,(string *)selector);
  this->arguments = arguments;
  return;
}

Assistant:

MethodHeader::MethodHeader(const std::string &selector, ArgumentList *arguments)
	: selector(selector), arguments(arguments)
{
}